

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillSystemEnvironmentPath(cmFindBase *this)

{
  mapped_type *this_00;
  allocator local_31;
  string local_30;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::SystemEnvironment);
  if ((this->EnvironmentPath)._M_string_length != 0) {
    cmSearchPath::AddEnvPath(this_00,&this->EnvironmentPath);
    std::__cxx11::string::string((string *)&local_30,"PATH",&local_31);
    cmSearchPath::AddEnvPrefixPath(this_00,&local_30,true);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::string((string *)&local_30,"PATH",&local_31);
  cmSearchPath::AddEnvPath(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillSystemEnvironmentPath()
{
  cmSearchPath &paths = this->LabeledPaths[PathLabel::SystemEnvironment];

  // Add LIB or INCLUDE
  if(!this->EnvironmentPath.empty())
    {
    paths.AddEnvPath(this->EnvironmentPath);
    paths.AddEnvPrefixPath("PATH", true);
    }
  // Add PATH
  paths.AddEnvPath("PATH");
  paths.AddSuffixes(this->SearchPathSuffixes);
}